

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<capnproto_test::capnp::test::TestAllTypes::Builder&,char_const*>
          (String *__return_storage_ptr__,kj *this,Builder *params,char **params_1)

{
  SegmentBuilder *__s;
  StructReader reader;
  char *pcVar1;
  size_t sVar2;
  Branch *pBVar3;
  StringTree local_88;
  SegmentBuilder *local_50;
  char *pcStack_48;
  size_t local_40;
  ArrayDisposer *pAStack_38;
  Branch *local_30;
  size_t sStack_28;
  
  capnp::_::StructBuilder::asReader((StructBuilder *)this);
  reader.capTable = (CapTableReader *)pcStack_48;
  reader.segment = &local_50->super_SegmentReader;
  reader.data = (void *)local_40;
  reader.pointers = (WirePointer *)pAStack_38;
  reader._32_8_ = local_30;
  reader._40_8_ = sStack_28;
  capnp::_::structString
            (&local_88,reader,(RawBrandedSchema *)(capnp::schemas::s_a0a8f314b80b63fd + 0x48));
  __s = (params->_builder).segment;
  pcStack_48 = (char *)strlen((char *)__s);
  local_50 = __s;
  _::concat<kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_88,(StringTree *)&local_50,
             (ArrayPtr<const_char> *)params_1);
  sVar2 = local_88.branches.size_;
  pBVar3 = local_88.branches.ptr;
  if (local_88.branches.ptr != (Branch *)0x0) {
    local_88.branches.ptr = (Branch *)0x0;
    local_88.branches.size_ = 0;
    (*(code *)**(undefined8 **)local_88.branches.disposer)
              (local_88.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = local_88.text.content.size_;
  pcVar1 = local_88.text.content.ptr;
  if (local_88.text.content.ptr != (char *)0x0) {
    local_88.text.content.ptr = (char *)0x0;
    local_88.text.content.size_ = 0;
    (*(code *)**(undefined8 **)local_88.text.content.disposer)
              (local_88.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}